

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void I422ToRGB565Row_C(uint8_t *src_y,uint8_t *src_u,uint8_t *src_v,uint8_t *dst_rgb565,
                      YuvConstants *yuvconstants,int width)

{
  uint8_t u;
  uint8_t v;
  undefined4 in_register_0000008c;
  int iVar1;
  long lVar2;
  uint8_t r1;
  uint8_t g1;
  uint8_t b1;
  byte local_5a;
  byte local_59;
  byte local_58;
  byte local_57;
  byte local_56;
  byte local_55;
  int local_54;
  uint8_t *local_50;
  uint8_t *local_48;
  uint8_t *local_40;
  ulong local_38;
  
  local_38 = CONCAT44(in_register_0000008c,width);
  local_54 = width + -1;
  lVar2 = 0;
  local_50 = src_u;
  local_48 = src_v;
  local_40 = dst_rgb565;
  for (iVar1 = 0; iVar1 < local_54; iVar1 = iVar1 + 2) {
    u = local_50[lVar2];
    v = local_48[lVar2];
    libyuv::YuvPixel(src_y[lVar2 * 2],u,v,&local_58,&local_59,&local_5a,yuvconstants);
    libyuv::YuvPixel(src_y[lVar2 * 2 + 1],u,v,&local_55,&local_56,&local_57,yuvconstants);
    local_58 = local_58 >> 3;
    local_59 = local_59 >> 2;
    local_5a = local_5a >> 3;
    local_55 = local_55 >> 3;
    local_56 = local_56 >> 2;
    local_57 = local_57 >> 3;
    *(uint *)(local_40 + lVar2 * 4) =
         (uint)local_57 << 0x1b |
         (uint)local_56 << 0x15 |
         (uint)local_55 << 0x10 | (uint)local_5a << 0xb | (uint)local_59 << 5 | (uint)local_58;
    lVar2 = lVar2 + 1;
  }
  if ((local_38 & 1) != 0) {
    libyuv::YuvPixel(src_y[lVar2 * 2],local_50[lVar2],local_48[lVar2],&local_58,&local_59,&local_5a,
                     yuvconstants);
    *(ushort *)(local_40 + lVar2 * 4) =
         (local_5a & 0xfff8) << 8 | (ushort)(local_58 >> 3) + (local_59 & 0xfc) * 8;
  }
  return;
}

Assistant:

void I422ToRGB565Row_C(const uint8_t* src_y,
                       const uint8_t* src_u,
                       const uint8_t* src_v,
                       uint8_t* dst_rgb565,
                       const struct YuvConstants* yuvconstants,
                       int width) {
  uint8_t b0;
  uint8_t g0;
  uint8_t r0;
  uint8_t b1;
  uint8_t g1;
  uint8_t r1;
  int x;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel(src_y[0], src_u[0], src_v[0], &b0, &g0, &r0, yuvconstants);
    YuvPixel(src_y[1], src_u[0], src_v[0], &b1, &g1, &r1, yuvconstants);
    b0 = b0 >> 3;
    g0 = g0 >> 2;
    r0 = r0 >> 3;
    b1 = b1 >> 3;
    g1 = g1 >> 2;
    r1 = r1 >> 3;
    *(uint32_t*)(dst_rgb565) =
        b0 | (g0 << 5) | (r0 << 11) | (b1 << 16) | (g1 << 21) | (r1 << 27);
    src_y += 2;
    src_u += 1;
    src_v += 1;
    dst_rgb565 += 4;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel(src_y[0], src_u[0], src_v[0], &b0, &g0, &r0, yuvconstants);
    b0 = b0 >> 3;
    g0 = g0 >> 2;
    r0 = r0 >> 3;
    *(uint16_t*)(dst_rgb565) = b0 | (g0 << 5) | (r0 << 11);
  }
}